

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_generated.h
# Opt level: O3

Offset<reflection::Field>
reflection::CreateField
          (FlatBufferBuilder *_fbb,Offset<flatbuffers::String> name,Offset<reflection::Type> type,
          uint16_t id,uint16_t offset,int64_t default_integer,double default_real,bool deprecated,
          bool required,bool key,
          Offset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,_unsigned_int>_>
          attributes,
          Offset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,_unsigned_int>_>
          documentation,bool optional,uint16_t padding,bool offset64)

{
  Offset<reflection::Field> OVar1;
  FieldBuilder local_40;
  
  local_40.fbb_ = _fbb;
  flatbuffers::FlatBufferBuilderImpl<false>::NotNested(_fbb);
  _fbb->nested = true;
  local_40.start_ = (_fbb->buf_).size_;
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<double>(_fbb,0xe,default_real,0.0);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<long>(_fbb,0xc,default_integer,0);
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<flatbuffers::String>,unsigned_int>>
            (_fbb,0x18,documentation);
  flatbuffers::FlatBufferBuilderImpl<false>::
  AddOffset<flatbuffers::Vector<flatbuffers::Offset<reflection::KeyValue>,unsigned_int>>
            (_fbb,0x16,attributes);
  flatbuffers::FlatBufferBuilderImpl<false>::AddOffset<reflection::Type>(_fbb,6,type);
  flatbuffers::FlatBufferBuilderImpl<false>::AddOffset<flatbuffers::String>(_fbb,4,name);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_short>(_fbb,0x1c,padding,0);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_short>(_fbb,10,offset,0);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_short>(_fbb,8,id,0);
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_char>(_fbb,0x1e,offset64,'\0');
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_char>(_fbb,0x1a,optional,'\0');
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_char>(_fbb,0x14,key,'\0');
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_char>(_fbb,0x12,required,'\0');
  flatbuffers::FlatBufferBuilderImpl<false>::AddElement<unsigned_char>(_fbb,0x10,deprecated,'\0');
  OVar1 = FieldBuilder::Finish(&local_40);
  return (Offset<reflection::Field>)OVar1.o;
}

Assistant:

inline ::flatbuffers::Offset<Field> CreateField(
    ::flatbuffers::FlatBufferBuilder &_fbb,
    ::flatbuffers::Offset<::flatbuffers::String> name = 0,
    ::flatbuffers::Offset<reflection::Type> type = 0,
    uint16_t id = 0,
    uint16_t offset = 0,
    int64_t default_integer = 0,
    double default_real = 0.0,
    bool deprecated = false,
    bool required = false,
    bool key = false,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<reflection::KeyValue>>> attributes = 0,
    ::flatbuffers::Offset<::flatbuffers::Vector<::flatbuffers::Offset<::flatbuffers::String>>> documentation = 0,
    bool optional = false,
    uint16_t padding = 0,
    bool offset64 = false) {
  FieldBuilder builder_(_fbb);
  builder_.add_default_real(default_real);
  builder_.add_default_integer(default_integer);
  builder_.add_documentation(documentation);
  builder_.add_attributes(attributes);
  builder_.add_type(type);
  builder_.add_name(name);
  builder_.add_padding(padding);
  builder_.add_offset(offset);
  builder_.add_id(id);
  builder_.add_offset64(offset64);
  builder_.add_optional(optional);
  builder_.add_key(key);
  builder_.add_required(required);
  builder_.add_deprecated(deprecated);
  return builder_.Finish();
}